

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O0

uint If_CluSemiCanonicize(word *pTruth,int nVars,int *pCanonPerm)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  word *pwVar4;
  int Counter;
  int fChange;
  int Temp;
  int i;
  uint uCanonPhase;
  int pStore [32];
  word *pTemp;
  word *pOut;
  word *pIn;
  word pFunc [1024];
  int *pCanonPerm_local;
  int nVars_local;
  word *pTruth_local;
  
  pTemp = (word *)&pIn;
  Temp = 0;
  bVar2 = 0;
  If_CluCountOnesInCofs(pTruth,nVars,&i);
  for (fChange = 0; fChange < nVars; fChange = fChange + 1) {
    if ((&i)[fChange * 2 + 1] < (&i)[fChange << 1]) {
      Temp = 1 << ((byte)fChange & 0x1f) | Temp;
      iVar1 = (&i)[fChange << 1];
      (&i)[fChange << 1] = (&i)[fChange * 2 + 1];
      (&i)[fChange * 2 + 1] = iVar1;
      If_CluChangePhase(pTruth,nVars,fChange);
    }
  }
  for (fChange = 0; pOut = pTruth, fChange < nVars; fChange = fChange + 1) {
    pCanonPerm[fChange] = fChange;
  }
  do {
    bVar3 = false;
    for (fChange = 0; pwVar4 = pOut, fChange < nVars + -1; fChange = fChange + 1) {
      if ((&i)[(fChange + 1) * 2] < (&i)[fChange << 1]) {
        bVar2 = bVar2 + 1;
        bVar3 = true;
        iVar1 = pCanonPerm[fChange];
        pCanonPerm[fChange] = pCanonPerm[fChange + 1];
        pCanonPerm[fChange + 1] = iVar1;
        iVar1 = (&i)[fChange << 1];
        (&i)[fChange << 1] = (&i)[(fChange + 1) * 2];
        (&i)[(fChange + 1) * 2] = iVar1;
        iVar1 = (&i)[fChange * 2 + 1];
        (&i)[fChange * 2 + 1] = (&i)[(fChange + 1) * 2 + 1];
        (&i)[(fChange + 1) * 2 + 1] = iVar1;
        If_CluSwapAdjacent(pTemp,pOut,fChange,nVars);
        pOut = pTemp;
        pTemp = pwVar4;
      }
    }
  } while (bVar3);
  if ((bool)(bVar2 & 1)) {
    If_CluCopy(pTemp,pOut,nVars);
  }
  return Temp;
}

Assistant:

unsigned If_CluSemiCanonicize( word * pTruth, int nVars, int * pCanonPerm )
{
    word pFunc[CLU_WRD_MAX], * pIn = pTruth, * pOut = pFunc, * pTemp;
    int pStore[CLU_VAR_MAX*2];
    unsigned uCanonPhase = 0;
    int i, Temp, fChange, Counter = 0;
//Kit_DsdPrintFromTruth( (unsigned*)pTruth, nVars ); printf( "\n" );

    // collect signatures 
    If_CluCountOnesInCofs( pTruth, nVars, pStore );
    // canonicize phase
    for ( i = 0; i < nVars; i++ )
    {
        if ( pStore[2*i+0] <= pStore[2*i+1] )
            continue;
        uCanonPhase |= (1 << i);
        Temp = pStore[2*i+0];
        pStore[2*i+0] = pStore[2*i+1];
        pStore[2*i+1] = Temp;
        If_CluChangePhase( pIn, nVars, i );
    }
    // compute permutation
    for ( i = 0; i < nVars; i++ )
        pCanonPerm[i] = i;
    do {
        fChange = 0;
        for ( i = 0; i < nVars-1; i++ )
        {
            if ( pStore[2*i] <= pStore[2*(i+1)] )
                continue;
            Counter++;
            fChange = 1;

            Temp = pCanonPerm[i];
            pCanonPerm[i] = pCanonPerm[i+1];
            pCanonPerm[i+1] = Temp;

            Temp = pStore[2*i];
            pStore[2*i] = pStore[2*(i+1)];
            pStore[2*(i+1)] = Temp;

            Temp = pStore[2*i+1];
            pStore[2*i+1] = pStore[2*(i+1)+1];
            pStore[2*(i+1)+1] = Temp;

            If_CluSwapAdjacent( pOut, pIn, i, nVars );
            pTemp = pIn; pIn = pOut; pOut = pTemp;
        }
    } while ( fChange );
    // swap if it was moved an odd number of times
    if ( Counter & 1 )
        If_CluCopy( pOut, pIn, nVars );
    return uCanonPhase;
}